

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_put(BuildCtx *ctx,int start,...)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  dasm_State *pdVar4;
  dasm_ActList puVar5;
  dasm_Section *pdVar6;
  ulong uVar7;
  char in_AL;
  ulong uVar8;
  int *piVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  undefined8 in_R8;
  int *piVar13;
  void **ppvVar14;
  uint *puVar15;
  undefined8 in_R9;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  byte *pbVar20;
  byte *pbVar21;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pdVar4 = ctx->D;
  puVar5 = pdVar4->actionlist;
  pdVar6 = pdVar4->section;
  uVar16 = pdVar6->pos;
  iVar12 = pdVar6->ofs;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((int)uVar16 < pdVar6->epos) {
    piVar9 = pdVar6->rbuf;
  }
  else {
    uVar11 = pdVar6->bsize;
    uVar8 = uVar11 + 200;
    if (uVar11 < 0xffffffffffffff38) {
      uVar7 = 0x10;
      if (0x10 < uVar11) {
        uVar7 = uVar11;
      }
      do {
        uVar11 = uVar7;
        uVar7 = uVar11 * 2;
      } while (uVar11 < uVar8);
      piVar9 = (int *)realloc(pdVar6->buf,uVar11);
      pdVar6->buf = piVar9;
      if (piVar9 == (int *)0x0) {
        exit(1);
      }
      pdVar6->bsize = uVar11;
    }
    else {
      piVar9 = pdVar6->buf;
    }
    piVar9 = piVar9 + -(ulong)(uVar16 & 0xff000000);
    pdVar6->rbuf = piVar9;
    pdVar6->epos = (int)((ulong)(long)(int)uVar11 >> 2) + (uVar16 & 0xff000000) + -0x19;
  }
  piVar9[(int)uVar16] = start;
  local_100 = &ap[0].overflow_arg_area;
  uVar10 = 0x10;
  pbVar20 = puVar5 + start;
  iVar19 = uVar16 + 1;
LAB_00105b3f:
  while( true ) {
    iVar18 = iVar19;
    pbVar21 = pbVar20 + 1;
    bVar1 = *pbVar20;
    iVar19 = iVar18;
    if (0xe8 < bVar1) break;
    iVar12 = iVar12 + 1;
    pbVar20 = pbVar21;
  }
  switch(bVar1) {
  case 0xf4:
  case 0xf6:
    bVar2 = pbVar20[1];
    pbVar21 = pbVar20 + 2;
    piVar13 = (int *)((ulong)((uint)bVar2 * 4) + (long)pdVar4->lglabels);
    if (bVar2 < 0xf7) {
      if (((bVar2 < 10) && (-1 < *piVar13)) || (pdVar4->lgsize <= (ulong)bVar2 << 2))
      goto LAB_00105f0c;
      goto LAB_00105cda;
    }
    iVar19 = piVar13[-0xf6];
    piVar13 = piVar13 + -0xf6;
    if (iVar19 < 1) {
      iVar19 = 0;
    }
LAB_00105ce4:
    piVar9[iVar18] = iVar19;
    *piVar13 = iVar18;
    break;
  case 0xf5:
  case 0xf7:
    uVar11 = (ulong)uVar10;
    if (uVar11 < 0x29) {
      uVar10 = uVar10 + 8;
      ppvVar14 = (void **)((long)local_e8 + uVar11);
    }
    else {
      ppvVar14 = local_100;
      local_100 = local_100 + 1;
    }
    if (pdVar4->pcsize <= (ulong)((long)*(int *)ppvVar14 * 4)) {
LAB_00105efa:
      uVar16 = (int)pbVar21 + ~*(uint *)&pdVar4->actionlist | 0x14000000;
      goto LAB_00105f68;
    }
    piVar13 = pdVar4->pclabels + *(int *)ppvVar14;
LAB_00105cda:
    iVar19 = *piVar13;
    if (-1 < iVar19) goto LAB_00105ce4;
    piVar9[iVar18] = -iVar19;
    break;
  case 0xf8:
    pbVar21 = pbVar20 + 2;
    if (pdVar4->lgsize <= (ulong)pbVar20[1] * 4) {
LAB_00105f0c:
      pdVar4->status = (int)pbVar20 + 2 + ~*(uint *)&pdVar4->actionlist | 0x13000000;
      return;
    }
    puVar15 = (uint *)(pdVar4->lglabels + pbVar20[1]);
    goto LAB_00105e86;
  case 0xf9:
    uVar11 = (ulong)uVar10;
    if (uVar11 < 0x29) {
      uVar10 = uVar10 + 8;
      ppvVar14 = (void **)((long)local_e8 + uVar11);
    }
    else {
      ppvVar14 = local_100;
      local_100 = local_100 + 1;
    }
    if (pdVar4->pcsize <= (ulong)((long)*(int *)ppvVar14 * 4)) goto LAB_00105efa;
    puVar15 = (uint *)(pdVar4->pclabels + *(int *)ppvVar14);
LAB_00105e86:
    uVar16 = *puVar15;
    while (0 < (int)uVar16) {
      piVar13 = pdVar4->sections[uVar16 >> 0x18].rbuf;
      uVar3 = piVar13[uVar16];
      piVar13[uVar16] = iVar18;
      uVar16 = uVar3;
    }
    *puVar15 = -iVar18;
LAB_00105eb0:
    iVar17 = iVar18 + 1;
    goto LAB_00105eb6;
  case 0xfa:
    pbVar21 = pbVar20 + 2;
    iVar12 = iVar12 + (uint)pbVar20[1];
    goto LAB_00105eb0;
  case 0xfb:
    iVar12 = iVar12 + 4;
    pbVar20 = pbVar20 + 3;
    goto LAB_00105b3f;
  case 0xfc:
    iVar12 = iVar12 + 1;
    pbVar20 = pbVar20 + 2;
    goto LAB_00105b3f;
  case 0xfd:
    goto switchD_00105bb0_caseD_fd;
  case 0xfe:
    if ((int)(uint)*pbVar21 < pdVar4->maxsection) {
      pdVar4->section = pdVar4->sections + *pbVar21;
switchD_00105bb0_caseD_ff:
      pdVar6->pos = iVar18;
      pdVar6->ofs = iVar12;
    }
    else {
      uVar16 = (int)pbVar21 + ~*(uint *)&pdVar4->actionlist | 0x12000000;
LAB_00105f68:
      pdVar4->status = uVar16;
    }
    return;
  case 0xff:
    goto switchD_00105bb0_caseD_ff;
  default:
    if ((ulong)uVar10 < 0x29) {
      piVar9[iVar18] = *(int *)((long)local_e8 + (ulong)uVar10);
      (*(code *)(&DAT_0010d040 + *(int *)(&DAT_0010d040 + (ulong)(bVar1 - 0xe9) * 4)))();
      return;
    }
    piVar9[iVar18] = *(int *)local_100;
    (*(code *)(&DAT_0010d040 + *(int *)(&DAT_0010d040 + (ulong)(bVar1 - 0xe9) * 4)))
              (&switchD_00105bb0::switchdataD_0010d010,&DAT_0010d06c);
    return;
  }
  iVar19 = iVar18 + 1;
  iVar12 = iVar12 + 4;
  pbVar20 = pbVar21;
  if ((bVar1 & 0xfe) == 0xf4) {
    iVar17 = iVar18 + 2;
LAB_00105eb6:
    piVar9[iVar19] = iVar12;
    pbVar20 = pbVar21;
    iVar19 = iVar17;
  }
  goto LAB_00105b3f;
switchD_00105bb0_caseD_fd:
  pbVar20 = pbVar21;
  goto LAB_00105b3f;
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC)
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}